

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall QTextBrowser::backward(QTextBrowser *this)

{
  QTextBrowserPrivate *this_00;
  iterator iVar1;
  long in_FS_OFFSET;
  value_type local_a0;
  HistoryEntry local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextBrowserPrivate **)
             &(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.field_0x8
  ;
  if (1 < (ulong)(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>.d.size) {
    QTextBrowserPrivate::createHistoryEntry(&local_68,this_00);
    QList<QTextBrowserPrivate::HistoryEntry>::emplaceBack<QTextBrowserPrivate::HistoryEntry_const&>
              (&(this_00->forwardStack).super_QList<QTextBrowserPrivate::HistoryEntry>,&local_68);
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry(&local_68);
    QList<QTextBrowserPrivate::HistoryEntry>::takeLast
              (&local_a0,&(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    QTextBrowserPrivate::HistoryEntry::~HistoryEntry(&local_a0);
    iVar1 = QList<QTextBrowserPrivate::HistoryEntry>::end
                      (&(this_00->stack).super_QList<QTextBrowserPrivate::HistoryEntry>);
    QTextBrowserPrivate::restoreHistoryEntry(this_00,iVar1.i + -1);
    backwardAvailable(this,1 < (ulong)(this_00->stack).
                                      super_QList<QTextBrowserPrivate::HistoryEntry>.d.size);
    forwardAvailable(this,true);
    historyChanged(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::backward()
{
    Q_D(QTextBrowser);
    if (d->stack.size() <= 1)
        return;

    // Update the history entry
    d->forwardStack.push(d->createHistoryEntry());
    d->stack.pop(); // throw away the old version of the current entry
    d->restoreHistoryEntry(d->stack.top()); // previous entry
    emit backwardAvailable(d->stack.size() > 1);
    emit forwardAvailable(true);
    emit historyChanged();
}